

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::ConcurrencyLimitingHttpClient::openWebSocket
          (ConcurrencyLimitingHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  SourceLocation location;
  Promise<kj::HttpClient::WebSocketResponse> *pPVar1;
  ConnectionCounter *counter_00;
  String *pSVar2;
  HttpHeaders *pHVar3;
  Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
  *__x;
  uint __flags;
  StringPtr *params;
  void *__child_stack;
  ConcurrencyLimitingHttpClient *this_00;
  __fn *in_R8;
  void *__arg;
  undefined8 in_R9;
  undefined8 in_stack_fffffffffffffe10;
  ConcurrencyLimitingHttpClient *local_1a0;
  String local_198;
  HttpHeaders local_180;
  Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter> local_120;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6537:15),_kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  promise;
  HttpHeaders headersCopy;
  String urlCopy;
  SourceLocation local_98;
  undefined1 local_80 [8];
  PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
  paf;
  Promise<kj::HttpClient::WebSocketResponse> local_40;
  Promise<kj::HttpClient::WebSocketResponse> response;
  ConnectionCounter counter;
  HttpHeaders *headers_local;
  ConcurrencyLimitingHttpClient *this_local;
  StringPtr url_local;
  
  this_local = (ConcurrencyLimitingHttpClient *)url.content.size_;
  this_00 = (ConcurrencyLimitingHttpClient *)url.content.ptr;
  url_local.content.ptr = (char *)headers;
  url_local.content.size_ = (size_t)this;
  if (this_00->concurrentRequests < this_00->maxConcurrentRequests) {
    ConnectionCounter::ConnectionCounter((ConnectionCounter *)&response,this_00);
    (*this_00->inner->_vptr_HttpClient[1])
              (&local_40,this_00->inner,this_local,url_local.content.ptr,in_R8);
    fireCountChanged(this_00);
    pPVar1 = mv<kj::Promise<kj::HttpClient::WebSocketResponse>>(&local_40);
    counter_00 = mv<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                           ((ConnectionCounter *)&response);
    attachCounter(this,pPVar1,counter_00);
    Promise<kj::HttpClient::WebSocketResponse>::~Promise(&local_40);
    ConnectionCounter::~ConnectionCounter((ConnectionCounter *)&response);
  }
  else {
    __arg = (void *)0x10;
    SourceLocation::SourceLocation
              (&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"openWebSocket",0x1984);
    location.function = (char *)local_98._16_8_;
    location.fileName = local_98.function;
    location.lineNumber = (int)in_stack_fffffffffffffe10;
    location.columnNumber = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
    newPromiseAndFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
              (location);
    __flags = local_98.lineNumber;
    str<kj::StringPtr&>((String *)&headersCopy.ownedStrings.builder.disposer,(kj *)&this_local,
                        params);
    HttpHeaders::clone((HttpHeaders *)&promise,in_R8,__child_stack,__flags,__arg,in_R9,
                       local_98.fileName);
    local_1a0 = this_00;
    pSVar2 = mv<kj::String>((String *)&headersCopy.ownedStrings.builder.disposer);
    String::String(&local_198,pSVar2);
    pHVar3 = mv<kj::HttpHeaders>((HttpHeaders *)&promise);
    HttpHeaders::HttpHeaders(&local_180,pHVar3);
    Promise<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::
    then<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::_lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)_1_>
              (&local_120,(Type *)local_80);
    (anonymous_namespace)::ConcurrencyLimitingHttpClient::
    openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::
    {lambda(kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter&&)#1}::
    ~ConnectionCounter((_lambda_kj___anonymous_namespace___ConcurrencyLimitingHttpClient__ConnectionCounter____1_
                        *)&local_1a0);
    __x = mv<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,decltype(nullptr)>>
                    ((Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>
                      *)&paf);
    std::
    queue<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::deque<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>,_std::allocator<kj::Own<kj::PromiseFulfiller<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>,_std::nullptr_t>_>_>_>
    ::push(&this_00->pendingRequests,__x);
    fireCountChanged(this_00);
    pPVar1 = mv<kj::Promise<kj::HttpClient::WebSocketResponse>>
                       ((Promise<kj::HttpClient::WebSocketResponse> *)&local_120);
    Promise<kj::HttpClient::WebSocketResponse>::Promise
              ((Promise<kj::HttpClient::WebSocketResponse> *)this,pPVar1);
    Promise<kj::HttpClient::WebSocketResponse>::~Promise
              ((Promise<kj::HttpClient::WebSocketResponse> *)&local_120);
    HttpHeaders::~HttpHeaders((HttpHeaders *)&promise);
    String::~String((String *)&headersCopy.ownedStrings.builder.disposer);
    PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
    ::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
                *)local_80);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const kj::HttpHeaders& headers) override {
    if (concurrentRequests < maxConcurrentRequests) {
      auto counter = ConnectionCounter(*this);
      auto response = inner.openWebSocket(url, headers);
      fireCountChanged();
      return attachCounter(kj::mv(response), kj::mv(counter));
    }

    auto paf = kj::newPromiseAndFulfiller<ConnectionCounter>();
    auto urlCopy = kj::str(url);
    auto headersCopy = headers.clone();

    auto promise = paf.promise
        .then([this,
               urlCopy = kj::mv(urlCopy),
               headersCopy = kj::mv(headersCopy)](ConnectionCounter&& counter) mutable {
      return attachCounter(inner.openWebSocket(urlCopy, headersCopy), kj::mv(counter));
    });

    pendingRequests.push(kj::mv(paf.fulfiller));
    fireCountChanged();
    return kj::mv(promise);
  }